

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

bool pstore::json::is_valid(string *str)

{
  parser<pstore::json::null_output> p;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_b0;
  parser<pstore::json::null_output> local_a0;
  
  parser<pstore::json::null_output>::parser(&local_a0,0);
  local_b0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             gsl::make_span<std::__cxx11::string>(str);
  parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>
            (&local_a0,(span<const_char,__1L> *)&local_b0);
  parser<pstore::json::null_output>::eof(&local_a0);
  parser<pstore::json::null_output>::~parser(&local_a0);
  return local_a0.error_._M_value == 0;
}

Assistant:

bool is_valid (std::string const & str) {
            pstore::json::parser<pstore::json::null_output> p;
            p.input (pstore::gsl::make_span (str));
            p.eof ();
            return !p.has_error ();
        }